

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_add_hex_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  REF_STATUS RVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  char cVar16;
  long lVar17;
  char cVar18;
  long lVar19;
  long lVar20;
  undefined1 uVar21;
  uint uVar22;
  bool bVar23;
  REF_GLOB global [27];
  long local_108 [27];
  
  lVar8 = 0;
  do {
    iVar1 = nodes[lVar8];
    lVar14 = -1;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar14 = ref_node->global[iVar1], lVar14 < 0)) {
      lVar14 = -1;
    }
    local_108[lVar8] = lVar14;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (local_108[1] <= local_108[0]) {
    local_108[0] = local_108[1];
  }
  lVar8 = local_108[3];
  if (local_108[2] < local_108[3]) {
    lVar8 = local_108[2];
  }
  if (local_108[0] < lVar8) {
    lVar8 = local_108[0];
  }
  lVar14 = local_108[5];
  if (local_108[4] < local_108[5]) {
    lVar14 = local_108[4];
  }
  if (lVar8 <= lVar14) {
    lVar14 = lVar8;
  }
  lVar8 = local_108[7];
  if (local_108[6] < local_108[7]) {
    lVar8 = local_108[6];
  }
  if (lVar14 <= lVar8) {
    lVar8 = lVar14;
  }
  bVar23 = local_108[1] != lVar8;
  if (bVar23) {
    uVar13 = 2;
    uVar12 = 3;
    uVar9 = 4;
    lVar14 = 5;
    lVar19 = 6;
    uVar6 = 7;
  }
  else {
    uVar13 = 4;
    uVar12 = 5;
    uVar9 = 2;
    lVar14 = 3;
    lVar19 = 7;
    uVar6 = 6;
  }
  uVar22 = (uint)bVar23;
  uVar21 = !bVar23;
  if (local_108[2] == lVar8) {
    uVar21 = 2;
    uVar22 = 1;
    uVar13 = 5;
    uVar12 = 6;
    uVar9 = 3;
    lVar14 = 0;
    lVar19 = 4;
    uVar6 = 7;
  }
  if (local_108[3] == lVar8) {
    uVar21 = 3;
    uVar22 = 0;
    uVar13 = 1;
    uVar12 = 2;
    uVar9 = 7;
    lVar14 = 4;
    lVar19 = 5;
    uVar6 = 6;
  }
  if (local_108[4] == lVar8) {
    uVar21 = 4;
    uVar22 = 0;
    uVar13 = 3;
    uVar12 = 7;
    uVar9 = 5;
    lVar14 = 1;
    lVar19 = 2;
    uVar6 = 6;
  }
  if (local_108[5] == lVar8) {
    uVar21 = 5;
    uVar22 = 1;
    uVar13 = 0;
    uVar12 = 4;
    uVar9 = 6;
    lVar14 = 2;
    lVar19 = 3;
    uVar6 = 7;
  }
  if (local_108[6] == lVar8) {
    uVar21 = 6;
    uVar22 = 2;
    uVar13 = 1;
    uVar12 = 5;
    uVar9 = 7;
    lVar14 = 3;
    uVar6 = 4;
    lVar19 = 0;
  }
  if (local_108[7] == lVar8) {
    uVar21 = 7;
    uVar22 = 3;
    uVar13 = 2;
    uVar12 = 6;
    uVar9 = 4;
    lVar14 = 0;
    lVar19 = 1;
    uVar6 = 5;
  }
  lVar8 = local_108[lVar19];
  lVar19 = local_108[uVar22];
  if (lVar8 <= local_108[uVar22]) {
    lVar19 = lVar8;
  }
  lVar15 = local_108[uVar13];
  lVar3 = local_108[lVar14];
  lVar11 = lVar3;
  if (lVar15 < lVar3) {
    lVar11 = lVar15;
  }
  lVar20 = local_108[uVar12];
  if (lVar8 <= local_108[uVar12]) {
    lVar20 = lVar8;
  }
  lVar17 = local_108[uVar6];
  if (lVar17 <= lVar15) {
    lVar15 = lVar17;
  }
  if (local_108[uVar9] < lVar8) {
    lVar8 = local_108[uVar9];
  }
  if (lVar3 < lVar17) {
    lVar17 = lVar3;
  }
  cVar16 = '\0';
  if (lVar8 < lVar17) {
    cVar16 = 'x';
  }
  bVar23 = lVar20 < lVar15;
  if (lVar20 < lVar15) {
    cVar16 = '\0';
  }
  bVar4 = lVar19 < lVar11;
  if (lVar19 < lVar11) {
    cVar16 = '\0';
  }
  cVar18 = -0x10;
  if (lVar8 < lVar17) {
    cVar18 = cVar16;
  }
  bVar5 = lVar15 <= lVar20 && bVar4;
  if (lVar8 < lVar17) {
    bVar5 = lVar11 <= lVar19 && bVar23;
  }
  if (lVar11 > lVar19 || !bVar23) {
    cVar18 = cVar16;
  }
  if (bVar5) {
    cVar18 = '\0';
  }
  cVar16 = -0x10;
  if (lVar17 <= lVar8) {
    cVar16 = cVar18;
  }
  if (lVar15 > lVar20 || !bVar4) {
    cVar16 = cVar18;
  }
  cVar18 = 'x';
  if (lVar8 < lVar17) {
    cVar18 = cVar16;
  }
  if (!bVar4 || !bVar23) {
    cVar18 = cVar16;
  }
  cVar16 = '\0';
  if (lVar17 <= lVar8) {
    cVar16 = cVar18;
  }
  if (!bVar4 || !bVar23) {
    cVar16 = cVar18;
  }
  uVar6 = uVar9;
  uVar2 = uVar22;
  if ((cVar16 != -0x10) && (uVar6 = uVar12, uVar2 = uVar9, cVar16 == 'x')) {
    RVar7 = (*(code *)(&DAT_002296e8 +
                      *(int *)(&DAT_002296e8 +
                              (ulong)((uint)bVar23 + (uint)bVar4 + (uint)(lVar8 < lVar17)) * 4)))
                      (uVar22,ref_cell,
                       &DAT_002296e8 +
                       *(int *)(&DAT_002296e8 +
                               (ulong)((uint)bVar23 + (uint)bVar4 + (uint)(lVar8 < lVar17)) * 4),
                       lVar14,uVar21,uVar12,uVar13);
    return RVar7;
  }
  uVar10 = (ulong)((uint)bVar23 + (uint)bVar4 + (uint)(lVar8 < lVar17));
  RVar7 = (*(code *)(&DAT_002296e8 + *(int *)(&DAT_002296e8 + uVar10 * 4)))
                    (uVar6,ref_cell,uVar10,&DAT_002296e8 + *(int *)(&DAT_002296e8 + uVar10 * 4),
                     uVar21,uVar2);
  return RVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_hex_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes) {
  REF_INT node;
  REF_GLOB minnode, global[REF_CELL_MAX_SIZE_PER];
  REF_INT I[REF_CELL_MAX_SIZE_PER];
  REF_INT face0, face1, face2, deg, n;
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];

  for (node = 0; node < 8; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  /* permutaion with node 0 the smallest global index of the hex */

  minnode = MIN(MIN(global[0], global[1]), MIN(global[2], global[3]));
  minnode = MIN(MIN(global[4], global[5]), minnode);
  minnode = MIN(MIN(global[6], global[7]), minnode);

  I[0] = 0;
  I[1] = 1;
  I[2] = 2;
  I[3] = 3;
  I[4] = 4;
  I[5] = 5;
  I[6] = 6;
  I[7] = 7;
  if (global[1] == minnode) {
    I[0] = 1;
    I[1] = 0;
    I[2] = 4;
    I[3] = 5;
    I[4] = 2;
    I[5] = 3;
    I[6] = 7;
    I[7] = 6;
  }
  if (global[2] == minnode) {
    I[0] = 2;
    I[1] = 1;
    I[2] = 5;
    I[3] = 6;
    I[4] = 3;
    I[5] = 0;
    I[6] = 4;
    I[7] = 7;
  }
  if (global[3] == minnode) {
    I[0] = 3;
    I[1] = 0;
    I[2] = 1;
    I[3] = 2;
    I[4] = 7;
    I[5] = 4;
    I[6] = 5;
    I[7] = 6;
  }
  if (global[4] == minnode) {
    I[0] = 4;
    I[1] = 0;
    I[2] = 3;
    I[3] = 7;
    I[4] = 5;
    I[5] = 1;
    I[6] = 2;
    I[7] = 6;
  }
  if (global[5] == minnode) {
    I[0] = 5;
    I[1] = 1;
    I[2] = 0;
    I[3] = 4;
    I[4] = 6;
    I[5] = 2;
    I[6] = 3;
    I[7] = 7;
  }
  if (global[6] == minnode) {
    I[0] = 6;
    I[1] = 2;
    I[2] = 1;
    I[3] = 5;
    I[4] = 7;
    I[5] = 3;
    I[6] = 0;
    I[7] = 4;
  }
  if (global[7] == minnode) {
    I[0] = 7;
    I[1] = 3;
    I[2] = 2;
    I[3] = 6;
    I[4] = 4;
    I[5] = 0;
    I[6] = 1;
    I[7] = 5;
  }

  /* find the faces with diag toward I[7]*/
  face0 = MIN(global[I[1]], global[I[6]]) < MIN(global[I[2]], global[I[5]]);
  face1 = MIN(global[I[3]], global[I[6]]) < MIN(global[I[2]], global[I[7]]);
  face2 = MIN(global[I[4]], global[I[6]]) < MIN(global[I[5]], global[I[7]]);
  deg = 0; /* table 5 */
  if (0 == face0 && 0 == face1 && 0 == face2) deg = 0;
  if (0 == face0 && 0 == face1 && 1 == face2) deg = 120;
  if (0 == face0 && 1 == face1 && 0 == face2) deg = 240;
  if (0 == face0 && 1 == face1 && 1 == face2) deg = 0;
  if (1 == face0 && 0 == face1 && 0 == face2) deg = 0;
  if (1 == face0 && 0 == face1 && 1 == face2) deg = 240;
  if (1 == face0 && 1 == face1 && 0 == face2) deg = 120;
  if (1 == face0 && 1 == face1 && 1 == face2) deg = 0;
  if (120 == deg) {
    ref_shard_permute_hex_120(I);
  }
  if (240 == deg) {
    ref_shard_permute_hex_120(I);
    ref_shard_permute_hex_120(I);
  }

  n = face0 + face1 + face2;

  switch (n) {
    case 0:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[3]];
      tet_nodes[3] = nodes[I[7]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[2]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      /* n=0 has 5 tets */
      break;
    case 1:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[3]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[1]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    case 2:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[4]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[4]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[1]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[5]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[5]];
      tet_nodes[3] = nodes[I[2]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    case 3:
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[2]];
      tet_nodes[2] = nodes[I[3]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[3]];
      tet_nodes[2] = nodes[I[7]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[7]];
      tet_nodes[2] = nodes[I[4]];
      tet_nodes[3] = nodes[I[6]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[0]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[4]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[5]];
      tet_nodes[2] = nodes[I[6]];
      tet_nodes[3] = nodes[I[0]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      tet_nodes[0] = nodes[I[1]];
      tet_nodes[1] = nodes[I[6]];
      tet_nodes[2] = nodes[I[2]];
      tet_nodes[3] = nodes[I[0]];
      RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
      break;
    default:
      RSB(REF_IMPLEMENT, "should be 0-3", printf("n %d\n", n););
      break;
  }

  return REF_SUCCESS;
}